

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall DetectorSS::Merge(DetectorSS *this,DetectorSS *detector)

{
  uchar **ppuVar1;
  key_tp **ppkVar2;
  int **ppiVar3;
  DetectorSS *in_RSI;
  DetectorSS *in_RDI;
  int j;
  int i;
  int **level;
  key_tp **skey;
  uchar **counts;
  DetectorSS *ss;
  int local_38;
  int local_34;
  
  ppuVar1 = GetTable(in_RSI);
  ppkVar2 = GetKey(in_RSI);
  ppiVar3 = GetLevel(in_RSI);
  for (local_34 = 0; local_34 < (in_RDI->ss_).depth; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < (in_RDI->ss_).width; local_38 = local_38 + 1) {
      Mergebmp(in_RDI,(in_RDI->ss_).counts[local_34],ppuVar1[local_34],
               local_38 * (in_RDI->ss_).offsets[(in_RDI->ss_).c],
               (in_RDI->ss_).offsets[(in_RDI->ss_).c]);
      if ((in_RDI->ss_).level[local_34][local_38] <= ppiVar3[local_34][local_38]) {
        (in_RDI->ss_).skey[local_34][local_38] = ppkVar2[local_34][local_38];
        (in_RDI->ss_).level[local_34][local_38] = ppiVar3[local_34][local_38];
      }
    }
  }
  return;
}

Assistant:

void DetectorSS::Merge(DetectorSS* detector) {
	DetectorSS* ss = (DetectorSS*)detector;
	unsigned char** counts = ss->GetTable();
	key_tp** skey = ss->GetKey();
	int** level = ss->GetLevel();
	for (int i = 0; i < ss_.depth; i++) {
		for (int j = 0; j < ss_.width; j++) {
			Mergebmp(ss_.counts[i], counts[i], j * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
			if (ss_.level[i][j] <= level[i][j]) {
				ss_.skey[i][j] = skey[i][j];
				ss_.level[i][j] = level[i][j];
			}
		}
	}
}